

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O1

void poly_genresult(ssh2_mac *mac,uchar *blk)

{
  ulong *puVar1;
  BinarySink *pBVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  BinarySink *pBVar8;
  BignumInt v5;
  long lVar9;
  ulong uVar10;
  ssh2_macalg *psVar11;
  uchar *data_1;
  ssh2_macalg *psVar12;
  uchar *data;
  bool bVar13;
  bool bVar14;
  ulong local_38 [4];
  
  if (*(int *)&mac[-3].binarysink_ != 0) {
    poly1305_feed_chunk((poly1305 *)&mac[-8].binarysink_,(uchar *)&mac[-4].binarysink_,
                        *(int *)&mac[-3].binarysink_);
  }
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  bVar5 = 0;
  lVar9 = 0;
  do {
    puVar1 = (ulong *)((long)local_38 + (ulong)((uint)lVar9 & 0xfffffff8));
    *puVar1 = *puVar1 | (ulong)*(byte *)((long)&mac[-8].binarysink_ + lVar9) << (bVar5 & 0x38);
    lVar9 = lVar9 + 1;
    bVar5 = bVar5 + 8;
  } while (lVar9 != 0x10);
  uVar6 = (uint)mac[-4].vt & 3;
  uVar3 = ((ulong)mac[-4].vt >> 2) * 5;
  uVar10 = (long)&(mac[-5].vt)->new + uVar3;
  pBVar2 = mac[-5].binarysink_;
  uVar3 = (ulong)CARRY8(uVar3,(ulong)mac[-5].vt);
  uVar7 = (long)&pBVar2->write + uVar3;
  uVar4 = (ulong)(uVar6 + CARRY8((ulong)pBVar2,uVar3) +
                  (uint)CARRY8(uVar7,(ulong)(0xfffffffffffffffa < uVar10)) >> 2) * 5;
  psVar12 = (ssh2_macalg *)(uVar4 + uVar10);
  uVar4 = (ulong)CARRY8(uVar4,uVar10);
  pBVar8 = (BinarySink *)(uVar7 + uVar4);
  psVar11 = (ssh2_macalg *)
            (ulong)(CARRY8(uVar7,uVar4) + uVar6 + (uint)CARRY8((ulong)pBVar2,uVar3) & 3);
  mac[-5].vt = psVar12;
  mac[-5].binarysink_ = pBVar8;
  mac[-4].vt = psVar11;
  bVar13 = CARRY8(local_38[0],(ulong)psVar12);
  local_38[0] = (long)&psVar12->new + local_38[0];
  bVar14 = CARRY8(local_38[1],(ulong)pBVar8);
  uVar3 = (long)&pBVar8->write + local_38[1];
  local_38[1] = uVar3 + bVar13;
  local_38[2] = (long)&psVar11->new + (bVar14 || CARRY8(uVar3,(ulong)bVar13)) + local_38[2];
  bVar5 = 0;
  lVar9 = 0;
  do {
    blk[lVar9] = (uchar)(*(ulong *)((long)local_38 + (ulong)((uint)lVar9 & 0xfffffff8)) >>
                        (bVar5 & 0x38));
    lVar9 = lVar9 + 1;
    bVar5 = bVar5 + 8;
  } while (lVar9 != 0x10);
  return;
}

Assistant:

static void poly_genresult(ssh2_mac *mac, unsigned char *blk)
{
    struct ccp_context *ctx = container_of(mac, struct ccp_context, mac_if);
    poly1305_finalise(&ctx->mac, blk);
}